

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

int __thiscall libtorrent::aux::torrent::disconnect_peers(torrent *this,int num,error_code *ec)

{
  peer_connection **pppVar1;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  _Var2;
  peer_connection **pppVar3;
  vector<peer_connection_*> to_disconnect;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  local_38;
  
  local_38.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (peer_connection **)0x0;
  local_38.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (peer_connection **)0x0;
  local_38.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  resize(&local_38,(long)num);
  _Var2 = ::std::
          __partial_sort_copy<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(libtorrent::aux::peer_connection_const*,libtorrent::aux::peer_connection_const*)>>
                    ((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                      )(this->super_torrent_hot_members).m_connections.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                      )(this->super_torrent_hot_members).m_connections.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                      )local_38.
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                      )local_38.
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                     (_Iter_comp_iter<bool_(*)(const_libtorrent::aux::peer_connection_*,_const_libtorrent::aux::peer_connection_*)>
                      )0x32615a);
  pppVar1 = local_38.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pppVar3 = local_38.
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38.
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start = pppVar1, pppVar3 != _Var2._M_current;
      pppVar3 = pppVar3 + 1) {
    (*((*pppVar3)->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(*pppVar3,ec,1,0);
    pppVar1 = local_38.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pppVar1 != (peer_connection **)0x0) {
    operator_delete(pppVar1,(long)local_38.
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pppVar1
                   );
  }
  return (int)((ulong)((long)_Var2._M_current - (long)pppVar1) >> 3);
}

Assistant:

int torrent::disconnect_peers(int const num, error_code const& ec)
	{
		INVARIANT_CHECK;

#if TORRENT_USE_ASSERTS
		// make sure we don't have any dangling pointers
		for (auto p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			TORRENT_ASSERT(m_ses.has_peer(p));
		}
#endif
		aux::vector<peer_connection*> to_disconnect;
		to_disconnect.resize(num);
		auto end = std::partial_sort_copy(m_connections.begin(), m_connections.end()
			, to_disconnect.begin(), to_disconnect.end(), compare_disconnect_peer);
		for (auto* p : aux::range(to_disconnect.begin(), end))
		{
			TORRENT_ASSERT(p->associated_torrent().lock().get() == this);
			p->disconnect(ec, operation_t::bittorrent);
		}
		return static_cast<int>(end - to_disconnect.begin());
	}